

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O2

Sampler2D * __thiscall rsg::ExecutionContext::getSampler2D(ExecutionContext *this,Variable *sampler)

{
  const_iterator cVar1;
  const_iterator cVar2;
  int samplerNdx;
  key_type_conflict local_14;
  Variable *local_10;
  
  local_10 = sampler;
  cVar1 = std::
          _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
          ::find((_Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
                  *)this,&local_10);
  local_14 = **(key_type_conflict **)cVar1._M_node[1]._M_parent;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_rsg::Sampler2D>,_std::_Select1st<std::pair<const_int,_rsg::Sampler2D>_>,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::Sampler2D>_>_>
          ::find(&this->m_samplers2D->_M_t,&local_14);
  return (Sampler2D *)&cVar2._M_node[1]._M_parent;
}

Assistant:

const Sampler2D& ExecutionContext::getSampler2D (const Variable* sampler) const
{
	const ExecValueStorage* samplerVal = m_varValues.find(sampler)->second;

	int samplerNdx = samplerVal->getValue(sampler->getType()).asInt(0);

	return m_samplers2D.find(samplerNdx)->second;
}